

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestRunTest.cxx
# Opt level: O0

void __thiscall cmCTestRunTest::CompressOutput(cmCTestRunTest *this)

{
  cmCTest *this_00;
  int iVar1;
  uchar *puVar2;
  undefined8 uVar3;
  uchar *input;
  ostream *this_01;
  char *msg;
  size_t sVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  ulong local_260;
  size_t i;
  size_t rlen;
  uchar *encoded_buffer;
  ostringstream local_218 [8];
  ostringstream cmCTestLog_msg;
  uchar *out;
  int outSize;
  uchar *in;
  z_stream strm;
  int ret;
  cmCTestRunTest *this_local;
  
  puVar2 = (uchar *)std::__cxx11::string::c_str();
  uVar3 = std::__cxx11::string::size();
  auVar5._8_4_ = (int)((ulong)uVar3 >> 0x20);
  auVar5._0_8_ = uVar3;
  auVar5._12_4_ = 0x45300000;
  iVar1 = (int)(((auVar5._8_8_ - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,(int)uVar3) - 4503599627370496.0)) * 1.001 + 13.0);
  input = (uchar *)operator_new__((long)iVar1);
  strm.state = (internal_state *)0x0;
  strm.zalloc = (alloc_func)0x0;
  strm.zfree = (free_func)0x0;
  strm.reserved._4_4_ = cm_zlib_deflateInit_((z_streamp)&in,-1,"1.2.3",0x70);
  if (strm.reserved._4_4_ == 0) {
    strm.next_in._0_4_ = std::__cxx11::string::size();
    in = puVar2;
    strm.total_in = (uLong)input;
    strm.next_out._0_4_ = iVar1;
    strm.reserved._4_4_ = cm_zlib_deflate((z_streamp)&in,4);
    if (strm.reserved._4_4_ == 1) {
      cm_zlib_deflateEnd((z_streamp)&in);
      puVar2 = (uchar *)operator_new__((long)(int)((double)iVar1 * 1.5));
      sVar4 = cmsysBase64_Encode(input,strm._32_8_,puVar2,1);
      std::__cxx11::string::clear();
      for (local_260 = 0; local_260 < sVar4; local_260 = local_260 + 1) {
        std::__cxx11::string::operator+=((string *)&this->CompressedOutput,puVar2[local_260]);
      }
      if (strm._8_8_ != 0) {
        auVar6._8_4_ = strm._36_4_;
        auVar6._0_8_ = strm._32_8_;
        auVar6._12_4_ = 0x45300000;
        auVar7._8_4_ = strm._12_4_;
        auVar7._0_8_ = strm._8_8_;
        auVar7._12_4_ = 0x45300000;
        this->CompressionRatio =
             ((auVar6._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,strm.avail_out) - 4503599627370496.0)) /
             ((auVar7._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,strm.avail_in) - 4503599627370496.0));
      }
      if (puVar2 != (uchar *)0x0) {
        operator_delete__(puVar2);
      }
      if (input != (uchar *)0x0) {
        operator_delete__(input);
      }
    }
    else {
      std::__cxx11::ostringstream::ostringstream(local_218);
      this_01 = std::operator<<((ostream *)local_218,
                                "Error during output compression. Sending uncompressed output.");
      std::ostream::operator<<(this_01,std::endl<char,std::char_traits<char>>);
      this_00 = this->CTest;
      std::__cxx11::ostringstream::str();
      msg = (char *)std::__cxx11::string::c_str();
      cmCTest::Log(this_00,6,
                   "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestRunTest.cxx"
                   ,0x7e,msg,false);
      std::__cxx11::string::~string((string *)&encoded_buffer);
      std::__cxx11::ostringstream::~ostringstream(local_218);
      if (input != (uchar *)0x0) {
        operator_delete__(input);
      }
    }
  }
  else if (input != (uchar *)0x0) {
    operator_delete__(input);
  }
  return;
}

Assistant:

void cmCTestRunTest::CompressOutput()
{
  int ret;
  z_stream strm;

  unsigned char* in = reinterpret_cast<unsigned char*>(
    const_cast<char*>(this->ProcessOutput.c_str()));
  // zlib makes the guarantee that this is the maximum output size
  int outSize = static_cast<int>(
    static_cast<double>(this->ProcessOutput.size()) * 1.001 + 13.0);
  unsigned char* out = new unsigned char[outSize];

  strm.zalloc = Z_NULL;
  strm.zfree = Z_NULL;
  strm.opaque = Z_NULL;
  ret = deflateInit(&strm, -1); // default compression level
  if (ret != Z_OK) {
    delete[] out;
    return;
  }

  strm.avail_in = static_cast<uInt>(this->ProcessOutput.size());
  strm.next_in = in;
  strm.avail_out = outSize;
  strm.next_out = out;
  ret = deflate(&strm, Z_FINISH);

  if (ret != Z_STREAM_END) {
    cmCTestLog(this->CTest, ERROR_MESSAGE,
               "Error during output compression. Sending uncompressed output."
                 << std::endl);
    delete[] out;
    return;
  }

  (void)deflateEnd(&strm);

  unsigned char* encoded_buffer =
    new unsigned char[static_cast<int>(outSize * 1.5)];

  size_t rlen = cmsysBase64_Encode(out, strm.total_out, encoded_buffer, 1);

  this->CompressedOutput.clear();
  for (size_t i = 0; i < rlen; i++) {
    this->CompressedOutput += encoded_buffer[i];
  }

  if (strm.total_in) {
    this->CompressionRatio =
      static_cast<double>(strm.total_out) / static_cast<double>(strm.total_in);
  }

  delete[] encoded_buffer;
  delete[] out;
}